

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBlockCommand.cxx
# Opt level: O2

void __thiscall
anon_unknown.dwarf_d77cc7::cmBlockFunctionBlocker::~cmBlockFunctionBlocker
          (cmBlockFunctionBlocker *this)

{
  bool bVar1;
  
  (this->super_cmFunctionBlocker)._vptr_cmFunctionBlocker =
       (_func_int **)&PTR__cmBlockFunctionBlocker_00856438;
  bVar1 = std::bitset<8UL>::test(&(this->Scopes).Set,0);
  if (bVar1) {
    cmMakefile::RaiseScope(this->Makefile,&this->VariableNames);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->VariableNames);
  std::unique_ptr<cmMakefile::VariablePushPop,_std::default_delete<cmMakefile::VariablePushPop>_>::
  ~unique_ptr(&(this->BlockScope).VariableScope);
  std::unique_ptr<cmMakefile::PolicyPushPop,_std::default_delete<cmMakefile::PolicyPushPop>_>::
  ~unique_ptr(&(this->BlockScope).PolicyScope);
  cmFunctionBlocker::~cmFunctionBlocker(&this->super_cmFunctionBlocker);
  return;
}

Assistant:

cmBlockFunctionBlocker::~cmBlockFunctionBlocker()
{
  if (this->Scopes.contains(ScopeType::VARIABLES)) {
    this->Makefile->RaiseScope(this->VariableNames);
  }
}